

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

string * __thiscall
pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,wchar_t *str,size_t length)

{
  uint uVar1;
  wchar_t *pwVar2;
  string *psVar3;
  string *extraout_RAX;
  long lVar4;
  size_t size;
  
  if (str == (wchar_t *)0x0) {
    size = 0;
  }
  else {
    pwVar2 = (wchar_t *)0x0;
    size = 0;
    do {
      uVar1 = *(uint *)(this + (long)pwVar2 * 4);
      if (uVar1 < 0x10000) {
        lVar4 = 3 - (ulong)(uVar1 < 0x800);
        if (uVar1 < 0x80) {
          lVar4 = 1;
        }
        size = size + lVar4;
      }
      else {
        size = size + 4;
      }
      pwVar2 = (wchar_t *)((long)pwVar2 + 1);
    } while (str != pwVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar3 = (string *)std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)size);
  if (size == 0) {
    return psVar3;
  }
  anon_unknown_0::as_utf8_end
            ((__return_storage_ptr__->_M_dataplus)._M_p,size,(wchar_t *)this,(size_t)str);
  return extraout_RAX;
}

Assistant:

PUGI_IMPL_FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}